

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O1

word Abc_Isop7Cover(word *pOn,word *pOnDc,word *pRes,word CostLim,int *pCover)

{
  int *piVar1;
  byte *pbVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  word uRes2;
  word uRes1;
  word uRes0;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar8 = ~*pOnDc;
  if ((*pOn & uVar8) != 0) {
    __assert_fail("(pOn[0] & ~pOnDc[0]) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x99,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
  }
  uVar6 = pOn[1];
  if ((uVar6 & ~pOnDc[1]) != 0) {
    __assert_fail("(pOn[1] & ~pOnDc[1]) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x9a,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
  }
  wVar3 = Abc_Isop6Cover(*pOn & ~pOnDc[1],*pOnDc,&local_38,6,CostLim,pCover);
  if (wVar3 < CostLim) {
    piVar1 = pCover + ((long)wVar3 >> 0x20);
    piVar7 = piVar1;
    if (pCover == (int *)0x0) {
      piVar7 = (int *)0x0;
    }
    wVar4 = Abc_Isop6Cover(uVar6 & uVar8,pOnDc[1],&local_40,6,CostLim,piVar7);
    if (wVar4 + wVar3 < CostLim) {
      piVar7 = piVar1 + ((long)wVar4 >> 0x20);
      if (pCover == (int *)0x0) {
        piVar7 = (int *)0x0;
      }
      wVar5 = Abc_Isop6Cover(~local_40 & pOn[1] | ~local_38 & *pOn,pOnDc[1] & *pOnDc,&local_48,6,
                             CostLim,piVar7);
      uVar8 = wVar5 + wVar4 + wVar3;
      if (uVar8 < CostLim) {
        local_38 = local_38 | local_48;
        *pRes = local_38;
        local_40 = local_40 | local_48;
        pRes[1] = local_40;
        if (((*pOn & ~local_38) != 0) || ((local_38 & ~*pOnDc) != 0)) {
          __assert_fail("(pOn[0] & ~pRes[0]) == 0 && (pRes[0] & ~pOnDc[0]) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                        ,0xaa,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
        }
        if (((pOn[1] & ~local_40) != 0) || ((local_40 & ~pOnDc[1]) != 0)) {
          __assert_fail("(pOn[1] & ~pRes[1]) == 0 && (pRes[1] & ~pOnDc[1]) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                        ,0xab,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
        }
        if (pCover != (int *)0x0) {
          if (0 < (int)(wVar3 >> 0x20)) {
            uVar6 = 0;
            do {
              pbVar2 = (byte *)((long)pCover + uVar6 * 4 + 1);
              *pbVar2 = *pbVar2 | 0x10;
              uVar6 = uVar6 + 1;
            } while (wVar3 >> 0x20 != uVar6);
          }
          if (0 < (int)(wVar4 >> 0x20)) {
            uVar6 = 0;
            do {
              pbVar2 = (byte *)((long)piVar1 + uVar6 * 4 + 1);
              *pbVar2 = *pbVar2 | 0x20;
              uVar6 = uVar6 + 1;
            } while (wVar4 >> 0x20 != uVar6);
          }
        }
        CostLim = ((long)wVar4 >> 0x20) + ((long)wVar3 >> 0x20) + uVar8;
      }
    }
  }
  return CostLim;
}

Assistant:

word Abc_Isop7Cover( word * pOn, word * pOnDc, word * pRes, word CostLim, int * pCover )
{
    word uOn0, uOn1, uOn2, uOnDc2, uRes0, uRes1, uRes2;
    word Cost0, Cost1, Cost2;  int nVars = 6; 
    assert( (pOn[0] & ~pOnDc[0]) == 0 );
    assert( (pOn[1] & ~pOnDc[1]) == 0 );
    // cofactor
    uOn0 = pOn[0] & ~pOnDc[1];
    uOn1 = pOn[1] & ~pOnDc[0];
    // solve for cofactors
    Cost0 = Abc_IsopCheck( &uOn0, pOnDc,   &uRes0, nVars, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    Cost1 = Abc_IsopCheck( &uOn1, pOnDc+1, &uRes1, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    uOn2 = (pOn[0] & ~uRes0) | (pOn[1] & ~uRes1);
    uOnDc2 = pOnDc[0] & pOnDc[1];
    Cost2 = Abc_IsopCheck( &uOn2, &uOnDc2,  &uRes2, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    pRes[0] = uRes2 | uRes0;
    pRes[1] = uRes2 | uRes1;
    assert( (pOn[0] & ~pRes[0]) == 0 && (pRes[0] & ~pOnDc[0]) == 0 );
    assert( (pOn[1] & ~pRes[1]) == 0 && (pRes[1] & ~pOnDc[1]) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, nVars );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}